

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void lgx_compiler_cleanup(lgx_compiler_t *c)

{
  uint32_t *__ptr;
  lgx_ht_node_t *plVar1;
  lgx_rb_node_t *node;
  
  __ptr = (c->bc).buffer;
  if (__ptr != (uint32_t *)0x0) {
    free(__ptr);
  }
  for (plVar1 = lgx_ht_first(&c->constant); plVar1 != (lgx_ht_node_t *)0x0;
      plVar1 = lgx_ht_next(plVar1)) {
    lgx_const_del((lgx_const_t *)plVar1->v);
    plVar1->v = (void *)0x0;
  }
  lgx_ht_cleanup(&c->constant);
  for (plVar1 = lgx_ht_first(&c->global); plVar1 != (lgx_ht_node_t *)0x0;
      plVar1 = lgx_ht_next(plVar1)) {
    plVar1->v = (void *)0x0;
  }
  lgx_ht_cleanup(&c->global);
  for (node = lgx_rb_first(&c->exception); node != (lgx_rb_node_t *)0x0; node = lgx_rb_next(node)) {
    lgx_exception_del((lgx_exception_t *)node->value);
  }
  lgx_rb_cleanup(&c->exception);
  (c->global).tail = (lgx_ht_node_t *)0x0;
  (c->exception).root = (lgx_rb_node_t *)0x0;
  (c->global).table = (lgx_ht_node_t **)0x0;
  (c->global).head = (lgx_ht_node_t *)0x0;
  (c->constant).tail = (lgx_ht_node_t *)0x0;
  (c->global).size = 0;
  (c->global).length = 0;
  (c->constant).table = (lgx_ht_node_t **)0x0;
  (c->constant).head = (lgx_ht_node_t *)0x0;
  (c->bc).buffer = (uint32_t *)0x0;
  (c->constant).size = 0;
  (c->constant).length = 0;
  c->ast = (lgx_ast_t *)0x0;
  (c->bc).length = 0;
  (c->bc).size = 0;
  (c->exception).size = 0;
  (c->exception).key_type = LGX_RB_KEY_STRING;
  return;
}

Assistant:

void lgx_compiler_cleanup(lgx_compiler_t* c) {
    // 释放字节码缓存
    if(c->bc.buffer) {
        xfree(c->bc.buffer);
    }

    // 释放常量表
    lgx_ht_node_t *n;
    for (n = lgx_ht_first(&c->constant); n; n = lgx_ht_next(n)) {
        lgx_const_del(n->v);
        n->v = NULL;
    }
    lgx_ht_cleanup(&c->constant);

    // 释放全局变量
    for (n = lgx_ht_first(&c->global); n; n = lgx_ht_next(n)) {
        n->v = NULL;
    }
    lgx_ht_cleanup(&c->global);

    // 释放异常信息
    lgx_rb_node_t *node;
    for (node = lgx_rb_first(&c->exception); node; node = lgx_rb_next(node)) {
        lgx_exception_del((lgx_exception_t *)node->value);
    }
    lgx_rb_cleanup(&c->exception);

    // 重新初始化内存，避免野指针
    memset(c, 0, sizeof(lgx_compiler_t));
}